

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::AttConfig::endAddAttachment(AttConfig *this)

{
  size_t *psVar1;
  element_type *peVar2;
  Config *pCVar3;
  int iVar4;
  _Node *p_Var5;
  QPDFTime *qtm;
  string last_element;
  string local_60;
  string local_40;
  
  if (endAddAttachment()::now_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&endAddAttachment()::now_abi_cxx11_);
    if (iVar4 != 0) {
      QUtil::get_current_qpdf_time();
      QUtil::qpdf_time_to_pdf_time_abi_cxx11_
                (&endAddAttachment()::now_abi_cxx11_,(QUtil *)&local_60,qtm);
      __cxa_atexit(std::__cxx11::string::~string,&endAddAttachment()::now_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&endAddAttachment()::now_abi_cxx11_);
    }
  }
  if ((this->att).path._M_string_length == 0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"add attachment: no file specified","");
    usage(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  QUtil::path_basename(&local_60,&(this->att).path);
  if (local_60._M_string_length == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"file for --add-attachment may not be empty","");
    usage(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->att).filename._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).filename);
  }
  if ((this->att).key._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).key);
  }
  if ((this->att).creationdate._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).creationdate);
  }
  if ((this->att).moddate._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&(this->att).moddate);
  }
  peVar2 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = std::__cxx11::list<QPDFJob::AddAttachment,std::allocator<QPDFJob::AddAttachment>>::
           _M_create_node<QPDFJob::AddAttachment_const&>
                     ((list<QPDFJob::AddAttachment,std::allocator<QPDFJob::AddAttachment>> *)
                      &peVar2->attachments_to_add,&this->att);
  std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
  psVar1 = (size_t *)
           ((long)&(peVar2->attachments_to_add).
                   super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>
                   ._M_impl + 0x10);
  *psVar1 = *psVar1 + 1;
  pCVar3 = this->config;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return pCVar3;
}

Assistant:

QPDFJob::Config*
QPDFJob::AttConfig::endAddAttachment()
{
    static std::string now = QUtil::qpdf_time_to_pdf_time(QUtil::get_current_qpdf_time());
    if (this->att.path.empty()) {
        usage("add attachment: no file specified");
    }
    std::string last_element = QUtil::path_basename(this->att.path);
    if (last_element.empty()) {
        usage("file for --add-attachment may not be empty");
    }
    if (this->att.filename.empty()) {
        this->att.filename = last_element;
    }
    if (this->att.key.empty()) {
        this->att.key = last_element;
    }
    if (this->att.creationdate.empty()) {
        this->att.creationdate = now;
    }
    if (this->att.moddate.empty()) {
        this->att.moddate = now;
    }

    this->config->o.m->attachments_to_add.push_back(this->att);
    return this->config;
}